

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int parse_line(archive_read *a,archive_entry *entry,mtree *mtree,mtree_entry *mp,int *parsed_kws)

{
  char cVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t n;
  int64_t iVar5;
  ulong ns;
  int iVar6;
  uint type;
  byte *src;
  int iVar7;
  mtree_option *pmVar9;
  byte *local_60;
  archive_read *local_58;
  dev_t dev;
  int64_t local_48;
  archive_string *local_40;
  mtree *local_38;
  int iVar8;
  
  pmVar9 = (mtree_option *)&mp->options;
  local_40 = &mtree->contents_name;
  local_58 = a;
  local_38 = mtree;
  iVar6 = 0;
  do {
    pmVar9 = pmVar9->next;
    if (pmVar9 == (mtree_option *)0x0) {
      if ((iVar6 == 0) && (iVar6 = 0, (*parsed_kws & 0x100) == 0)) {
        archive_set_error(&local_58->archive,0x54,"Missing type keyword in mtree specification");
        iVar6 = -0x14;
      }
      return iVar6;
    }
    __s1 = pmVar9->value;
    cVar1 = *__s1;
    iVar8 = 0;
    iVar7 = 0;
    iVar3 = iVar8;
    if (cVar1 != '\0') {
      iVar2 = strcmp(__s1,"nochange");
      if (iVar2 == 0) {
        *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 0x10;
        iVar3 = iVar7;
      }
      else {
        iVar2 = strcmp(__s1,"optional");
        if (iVar2 == 0) {
          *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 8;
        }
        else {
          iVar2 = strcmp(__s1,"ignore");
          if (iVar2 != 0) {
            pcVar4 = strchr(__s1,0x3d);
            if (pcVar4 == (char *)0x0) {
              archive_set_error(&local_58->archive,0x54,"Malformed attribute \"%s\" (%d)",__s1,
                                (ulong)(uint)(int)cVar1);
LAB_0036b3af:
              iVar3 = -0x14;
            }
            else {
              *pcVar4 = '\0';
              src = (byte *)(pcVar4 + 1);
              local_60 = src;
              switch(*__s1) {
              case 'c':
                iVar3 = strcmp(__s1,"content");
                if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"contents"), iVar3 == 0)) {
                  iVar3 = 0;
                  parse_escapes((char *)src,(mtree_entry *)0x0);
                  (local_38->contents_name).length = 0;
                  n = strlen((char *)src);
                  archive_strncat(local_40,src,n);
                }
                else {
                  iVar2 = strcmp(__s1,"cksum");
                  iVar3 = iVar7;
                  if (iVar2 != 0) goto switchD_0036b0b1_caseD_64;
                }
                break;
              case 'd':
switchD_0036b0b1_caseD_64:
                iVar3 = strcmp(__s1,"device");
                if (iVar3 != 0) goto switchD_0036b0b1_caseD_66;
                *(byte *)parsed_kws = (byte)*parsed_kws | 1;
                iVar3 = parse_device(&dev,&local_58->archive,(char *)src);
                if (iVar3 == 0) {
                  archive_entry_set_rdev(entry,dev);
                }
                break;
              default:
switchD_0036b0b1_caseD_65:
                archive_set_error(&local_58->archive,0x54,"Unrecognized key %s=%s",__s1,src);
                goto LAB_0036b3af;
              case 'f':
switchD_0036b0b1_caseD_66:
                iVar3 = strcmp(__s1,"flags");
                if (iVar3 != 0) goto switchD_0036b0b1_caseD_67;
                *(byte *)parsed_kws = (byte)*parsed_kws | 2;
                archive_entry_copy_fflags_text(entry,(char *)src);
                iVar3 = iVar7;
                break;
              case 'g':
switchD_0036b0b1_caseD_67:
                iVar3 = strcmp(__s1,"gid");
                if (iVar3 == 0) {
                  *(byte *)parsed_kws = (byte)*parsed_kws | 4;
                  iVar5 = mtree_atol((char **)&local_60,10);
                  archive_entry_set_gid(entry,iVar5);
                  iVar3 = iVar7;
                }
                else {
                  iVar3 = strcmp(__s1,"gname");
                  if (iVar3 != 0) goto switchD_0036b0b1_caseD_69;
                  *(byte *)parsed_kws = (byte)*parsed_kws | 8;
                  archive_entry_copy_gname(entry,(char *)src);
                  iVar3 = iVar7;
                }
                break;
              case 'i':
switchD_0036b0b1_caseD_69:
                iVar3 = strcmp(__s1,"inode");
                if (iVar3 != 0) goto switchD_0036b0b1_caseD_6c;
                iVar5 = mtree_atol((char **)&local_60,10);
                archive_entry_set_ino(entry,iVar5);
                iVar3 = iVar7;
                break;
              case 'l':
switchD_0036b0b1_caseD_6c:
                iVar3 = strcmp(__s1,"link");
                if (iVar3 != 0) goto switchD_0036b0b1_caseD_6d;
                archive_entry_copy_symlink(entry,(char *)src);
                iVar3 = iVar7;
                break;
              case 'm':
switchD_0036b0b1_caseD_6d:
                iVar2 = strcmp(__s1,"md5");
                iVar3 = iVar7;
                if ((iVar2 != 0) && (iVar2 = strcmp(__s1,"md5digest"), iVar2 != 0)) {
                  iVar3 = strcmp(__s1,"mode");
                  if (iVar3 != 0) goto switchD_0036b0b1_caseD_6e;
                  if ((*src & 0xf8) != 0x30) {
                    archive_set_error(&local_58->archive,0x54,
                                      "Symbolic or non-octal mode \"%s\" unsupported",src);
                    goto LAB_0036b3af;
                  }
                  *(byte *)parsed_kws = (byte)*parsed_kws | 0x40;
                  iVar5 = mtree_atol((char **)&local_60,8);
                  archive_entry_set_perm(entry,(mode_t)iVar5);
                  iVar3 = iVar7;
                }
                break;
              case 'n':
switchD_0036b0b1_caseD_6e:
                iVar3 = strcmp(__s1,"nlink");
                if (iVar3 != 0) goto switchD_0036b0b1_caseD_72;
                *(byte *)parsed_kws = (byte)*parsed_kws | 0x20;
                iVar5 = mtree_atol((char **)&local_60,10);
                archive_entry_set_nlink(entry,(uint)iVar5);
                iVar3 = iVar7;
                break;
              case 'r':
switchD_0036b0b1_caseD_72:
                iVar3 = strcmp(__s1,"resdevice");
                if (iVar3 == 0) {
                  iVar3 = parse_device(&dev,&local_58->archive,(char *)src);
                  if (iVar3 == 0) {
                    archive_entry_set_dev(entry,dev);
                  }
                }
                else {
                  iVar2 = strcmp(__s1,"rmd160");
                  iVar3 = iVar7;
                  if ((iVar2 != 0) && (iVar2 = strcmp(__s1,"rmd160digest"), iVar2 != 0))
                  goto switchD_0036b0b1_caseD_73;
                }
                break;
              case 's':
switchD_0036b0b1_caseD_73:
                iVar2 = strcmp(__s1,"sha1");
                iVar3 = iVar8;
                if ((((iVar2 != 0) &&
                     (((iVar2 = strcmp(__s1,"sha1digest"), iVar3 = iVar7, iVar2 != 0 &&
                       (iVar2 = strcmp(__s1,"sha256"), iVar2 != 0)) &&
                      (iVar2 = strcmp(__s1,"sha256digest"), iVar2 != 0)))) &&
                    (((iVar2 = strcmp(__s1,"sha384"), iVar2 != 0 &&
                      (iVar2 = strcmp(__s1,"sha384digest"), iVar2 != 0)) &&
                     (iVar2 = strcmp(__s1,"sha512"), iVar2 != 0)))) &&
                   (iVar2 = strcmp(__s1,"sha512digest"), iVar2 != 0)) {
                  iVar3 = strcmp(__s1,"size");
                  if (iVar3 != 0) goto switchD_0036b0b1_caseD_74;
                  iVar5 = mtree_atol((char **)&local_60,10);
                  archive_entry_set_size(entry,iVar5);
                  iVar3 = iVar7;
                }
                break;
              case 't':
switchD_0036b0b1_caseD_74:
                iVar2 = strcmp(__s1,"tags");
                iVar3 = iVar8;
                if (iVar2 != 0) {
                  iVar3 = strcmp(__s1,"time");
                  if (iVar3 == 0) {
                    *(byte *)parsed_kws = (byte)*parsed_kws | 0x10;
                    iVar5 = mtree_atol((char **)&local_60,10);
                    if (*local_60 == 0x2e) {
                      local_60 = local_60 + 1;
                      local_48 = iVar5;
                      ns = mtree_atol((char **)&local_60,10);
                      iVar5 = local_48;
                      if ((long)ns < 0) {
                        ns = 0;
                      }
                      else if (0x3b9ac9fe < ns) {
                        ns = 999999999;
                      }
                    }
                    else {
                      ns = 0;
                    }
                    archive_entry_set_mtime(entry,iVar5,ns);
                    iVar3 = iVar7;
                  }
                  else {
                    iVar3 = strcmp(__s1,"type");
                    if (iVar3 != 0) goto switchD_0036b0b1_caseD_75;
                    switch(*src) {
                    case 0x62:
                      iVar3 = strcmp((char *)src,"block");
                      if (iVar3 != 0) goto switchD_0036b635_caseD_63;
                      type = 0x6000;
                      break;
                    case 99:
switchD_0036b635_caseD_63:
                      iVar3 = strcmp((char *)src,"char");
                      if (iVar3 != 0) goto switchD_0036b635_caseD_64;
                      type = 0x2000;
                      break;
                    case 100:
switchD_0036b635_caseD_64:
                      iVar3 = strcmp((char *)src,"dir");
                      if (iVar3 != 0) goto switchD_0036b635_caseD_66;
                      type = 0x4000;
                      break;
                    default:
switchD_0036b635_caseD_65:
                      archive_set_error(&local_58->archive,0x54,
                                        "Unrecognized file type \"%s\"; assuming \"file\"",src);
                      archive_entry_set_filetype(entry,0x8000);
                      goto LAB_0036b3af;
                    case 0x66:
switchD_0036b635_caseD_66:
                      iVar3 = strcmp((char *)src,"fifo");
                      if (iVar3 == 0) {
                        type = 0x1000;
                      }
                      else {
                        iVar3 = strcmp((char *)src,"file");
                        if (iVar3 != 0) goto switchD_0036b635_caseD_6c;
                        type = 0x8000;
                      }
                      break;
                    case 0x6c:
switchD_0036b635_caseD_6c:
                      iVar3 = strcmp((char *)src,"link");
                      if (iVar3 != 0) goto switchD_0036b635_caseD_65;
                      type = 0xa000;
                    }
                    archive_entry_set_filetype(entry,type);
                    *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 1;
                    iVar3 = iVar7;
                  }
                }
                break;
              case 'u':
switchD_0036b0b1_caseD_75:
                iVar3 = strcmp(__s1,"uid");
                if (iVar3 == 0) {
                  *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 2;
                  iVar5 = mtree_atol((char **)&local_60,10);
                  archive_entry_set_uid(entry,iVar5);
                  iVar3 = iVar7;
                }
                else {
                  iVar3 = strcmp(__s1,"uname");
                  if (iVar3 != 0) goto switchD_0036b0b1_caseD_65;
                  *(byte *)((long)parsed_kws + 1) = *(byte *)((long)parsed_kws + 1) | 4;
                  archive_entry_copy_uname(entry,(char *)src);
                  iVar3 = iVar7;
                }
              }
            }
          }
        }
      }
    }
    if (iVar3 < iVar6) {
      iVar6 = iVar3;
    }
  } while( true );
}

Assistant:

static int
parse_line(struct archive_read *a, struct archive_entry *entry,
    struct mtree *mtree, struct mtree_entry *mp, int *parsed_kws)
{
	struct mtree_option *iter;
	int r = ARCHIVE_OK, r1;

	for (iter = mp->options; iter != NULL; iter = iter->next) {
		r1 = parse_keyword(a, mtree, entry, iter, parsed_kws);
		if (r1 < r)
			r = r1;
	}
	if (r == ARCHIVE_OK && (*parsed_kws & MTREE_HAS_TYPE) == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Missing type keyword in mtree specification");
		return (ARCHIVE_WARN);
	}
	return (r);
}